

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O1

void pkg_deleteList(CharList *l)

{
  _CharList *p_Var1;
  
  if (l != (CharList *)0x0) {
    do {
      uprv_free_63(l->str);
      p_Var1 = l->next;
      uprv_free_63(l);
      l = p_Var1;
    } while (p_Var1 != (_CharList *)0x0);
  }
  return;
}

Assistant:

void pkg_deleteList(CharList *l)
{
  CharList *tmp;
  while(l != NULL)
  {
    uprv_free((void*)l->str);
    tmp = l;
    l = l->next;
    uprv_free(tmp);
  }
}